

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O1

obj * hold_another_object(obj *obj,char *drop_fmt,char *drop_arg,char *hold_msg)

{
  char cVar1;
  char cVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  obj *obj_00;
  char *__dest;
  int iVar7;
  char buf [256];
  obj *in_stack_fffffffffffffea8;
  char local_138 [264];
  
  if (((u.uprops[0x1e].intrinsic == 0) &&
      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    obj->field_0x4a = obj->field_0x4a | 0x20;
  }
  iVar7 = u.umonnum;
  iVar5 = u.umonster;
  if (obj->oartifact != '\0') {
    sVar3 = obj->otyp;
    uVar4 = *(uint *)&obj->field_0x4a;
    place_object(obj,level,(int)u.ux,(int)u.uy);
    iVar6 = touch_artifact(obj,&youmonst);
    if (iVar6 != 0) {
      if ((iVar7 == iVar5) || (u.umonnum != u.umonster)) {
        obj_extract_self(obj);
        if (sVar3 == 0x1a) {
          obj->otyp = 0x1a;
          *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffefff | uVar4 & 0x1000;
        }
        goto LAB_001ae7e4;
      }
      if (drop_fmt != (char *)0x0) {
        pline(drop_fmt,drop_arg);
      }
    }
    obj_extract_self(obj);
LAB_001ae808:
    dropy(obj);
    return obj;
  }
LAB_001ae7e4:
  if (u.uprops[0x25].extrinsic != 0 || u.uprops[0x25].intrinsic != 0) {
    if (drop_fmt != (char *)0x0) {
      pline(drop_fmt,drop_arg);
    }
    goto LAB_001ae808;
  }
  iVar5 = obj->quan;
  iVar6 = near_capacity();
  iVar7 = 2;
  if (2 < iVar6) {
    iVar7 = iVar6;
  }
  if (drop_arg == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    __dest = local_138;
    strcpy(__dest,drop_arg);
  }
  obj_00 = addinv(in_stack_fffffffffffffea8);
  iVar6 = inv_cnt();
  if ((0x34 < iVar6) ||
     (((obj_00->otyp != 0x210 || ((obj_00->field_0x4a & 1) == 0)) &&
      (iVar6 = near_capacity(), iVar7 < iVar6)))) {
    if (drop_fmt != (char *)0x0) {
      pline(drop_fmt,__dest);
    }
    if (iVar5 < obj_00->quan) {
      obj_00 = splitobj(obj_00,(long)iVar5);
    }
    dropx(obj_00);
    return obj_00;
  }
  if (((flags.autoquiver == '\0') || (uquiver != (obj *)0x0)) || (obj_00->owornmask != 0))
  goto LAB_001ae8d7;
  cVar1 = obj_00->oclass;
  if (cVar1 == '\x02') {
LAB_001ae8ff:
    if (2 < (byte)(objects[obj_00->otyp].oc_subtyp + 0x1bU)) {
      if ((cVar1 != '\r') && (cVar1 != '\x02')) goto LAB_001ae8d7;
      goto LAB_001ae932;
    }
  }
  else {
    if (cVar1 != '\r') {
      if (cVar1 != '\x06') goto LAB_001ae8d7;
      goto LAB_001ae8ff;
    }
LAB_001ae932:
    cVar2 = objects[obj_00->otyp].oc_subtyp;
    if ((cVar2 < -0x18) ||
       ((uwep == (obj *)0x0 || -0x16 < cVar2 ||
        ((int)cVar2 + (int)objects[uwep->otyp].oc_subtyp != 0)))) {
      if ((cVar1 != '\r') && (cVar1 != '\x02')) goto LAB_001ae8d7;
      cVar1 = objects[obj_00->otyp].oc_subtyp;
      if (((cVar1 < -0x18) || (uswapwep == (obj *)0x0 || -0x16 < cVar1)) ||
         ((int)cVar1 + (int)objects[uswapwep->otyp].oc_subtyp != 0)) goto LAB_001ae8d7;
    }
  }
  setuqwep(obj_00);
LAB_001ae8d7:
  if (drop_fmt == (char *)0x0 && hold_msg == (char *)0x0) {
    return obj_00;
  }
  prinv(hold_msg,obj_00,(long)iVar5);
  return obj_00;
}

Assistant:

struct obj *hold_another_object(struct obj *obj, const char *drop_fmt,
				const char *drop_arg, const char *hold_msg)
{
	char buf[BUFSZ];

	if (!Blind) obj->dknown = 1;	/* maximize mergibility */
	if (obj->oartifact) {
	    /* place_object may change these */
	    boolean crysknife = (obj->otyp == CRYSKNIFE);
	    int oerode = obj->oerodeproof;
	    boolean wasUpolyd = Upolyd;

	    /* in case touching this object turns out to be fatal */
	    place_object(obj, level, u.ux, u.uy);

	    if (!touch_artifact(obj, &youmonst)) {
		obj_extract_self(obj);	/* remove it from the floor */
		dropy(obj);		/* now put it back again :-) */
		return obj;
	    } else if (wasUpolyd && !Upolyd) {
		/* loose your grip if you revert your form */
		if (drop_fmt) pline(drop_fmt, drop_arg);
		obj_extract_self(obj);
		dropy(obj);
		return obj;
	    }
	    obj_extract_self(obj);
	    if (crysknife) {
		obj->otyp = CRYSKNIFE;
		obj->oerodeproof = oerode;
	    }
	}
	if (Fumbling) {
	    if (drop_fmt) pline(drop_fmt, drop_arg);
	    dropy(obj);
	} else {
	    long oquan = obj->quan;
	    int prev_encumbr = near_capacity();	/* before addinv() */

	    /* encumbrance only matters if it would now become worse
	       than max( current_value, stressed ) */
	    if (prev_encumbr < MOD_ENCUMBER) prev_encumbr = MOD_ENCUMBER;
	    /* addinv() may redraw the entire inventory, overwriting
	       drop_arg when it comes from something like doname() */
	    if (drop_arg) drop_arg = strcpy(buf, drop_arg);

	    obj = addinv(obj);
	    if (inv_cnt() > 52
		    || ((obj->otyp != LOADSTONE || !obj->cursed)
			&& near_capacity() > prev_encumbr)) {
		if (drop_fmt) pline(drop_fmt, drop_arg);
		/* undo any merge which took place */
		if (obj->quan > oquan) obj = splitobj(obj, oquan);
		dropx(obj);
	    } else {
		if (flags.autoquiver && !uquiver && !obj->owornmask &&
			(is_missile(obj) ||
			    ammo_and_launcher(obj, uwep) ||
			    ammo_and_launcher(obj, uswapwep)))
		    setuqwep(obj);
		if (hold_msg || drop_fmt) prinv(hold_msg, obj, oquan);
	    }
	}
	return obj;
}